

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int unquantize_i1r4(long row,uchar *input,long ntodo,double scale,double zero,int dither_method,
                   int nullcheck,uchar tnull,float nullval,char *nullarray,int *anynull,
                   float *output,int *status)

{
  float *pfVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  undefined7 in_register_00000089;
  uint uVar5;
  ulong uVar6;
  
  if (fits_rand_value == (float *)0x0) {
    uVar5 = fits_init_randoms();
    piVar2 = (int *)(ulong)uVar5;
    if (uVar5 != 0) goto LAB_0018e9dd;
  }
  pfVar1 = fits_rand_value;
  uVar6 = (row + -1) % 10000;
  iVar3 = (int)(fits_rand_value[uVar6] * 500.0);
  piVar2 = anynull;
  if (dither_method == 0) {
    if (0 < ntodo) {
      lVar4 = 0;
      do {
        anynull[lVar4] =
             (int)(float)((((double)input[lVar4] - (double)pfVar1[iVar3]) + 0.5) * scale + zero);
        iVar3 = iVar3 + 1;
        if (iVar3 == 10000) {
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          if (uVar5 == 10000) {
            uVar6 = 0;
          }
          iVar3 = (int)(pfVar1[(int)uVar6] * 500.0);
        }
        lVar4 = lVar4 + 1;
      } while (ntodo != lVar4);
    }
  }
  else if (0 < ntodo) {
    lVar4 = 0;
    do {
      if (input[lVar4] == (byte)nullcheck) {
        nullarray[0] = '\x01';
        nullarray[1] = '\0';
        nullarray[2] = '\0';
        nullarray[3] = '\0';
        if (dither_method == 1) {
          anynull[lVar4] = (int)nullval;
        }
        else {
          *(undefined1 *)(CONCAT71(in_register_00000089,tnull) + lVar4) = 1;
        }
      }
      else {
        anynull[lVar4] =
             (int)(float)((((double)input[lVar4] - (double)fits_rand_value[iVar3]) + 0.5) * scale +
                         zero);
      }
      iVar3 = iVar3 + 1;
      if (iVar3 == 10000) {
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        if (uVar5 == 10000) {
          uVar6 = 0;
        }
        iVar3 = (int)(fits_rand_value[(int)uVar6] * 500.0);
      }
      lVar4 = lVar4 + 1;
    } while (ntodo != lVar4);
  }
LAB_0018e9dd:
  return (int)piVar2;
}

Assistant:

static int unquantize_i1r4(long row, /* tile number = row number in table  */
            unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int dither_method,    /* I - dithering method to use             */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
            float nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            float *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
    Unquantize byte values into the scaled floating point values
*/
{
    long ii;
    int nextrand, iseed;

    if (!fits_rand_value) 
       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

    /* initialize the index to the next random number in the list */
    iseed = (int) ((row - 1) % N_RANDOM);
    nextrand = (int) (fits_rand_value[iseed] * 500);

    if (nullcheck == 0)     /* no null checking required */
    {
             for (ii = 0; ii < ntodo; ii++)
            {
/*
		if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		    output[ii] = 0.0;
		else
*/
                    output[ii] = (float) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }
    else        /* must check for null values */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
/*
		    if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		        output[ii] = 0.0;
		    else
*/
                        output[ii] = (float) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);
                } 

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
            }
    }

    return(*status);
}